

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_check_magic.c
# Opt level: O3

void errmsg(char *m)

{
  size_t __n;
  ssize_t sVar1;
  
  __n = strlen(m);
  while ((__n != 0 && (sVar1 = write(2,m,__n), 0 < sVar1))) {
    m = m + sVar1;
    __n = __n - sVar1;
  }
  return;
}

Assistant:

static void
errmsg(const char *m)
{
	size_t s = strlen(m);
	ssize_t written;

	while (s > 0) {
		written = write(2, m, s);
		if (written <= 0)
			return;
		m += written;
		s -= written;
	}
}